

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReaderIncrInit(PmaReader *pReadr,int eMode)

{
  _func_void_ptr_void_ptr *in_RDI;
  void *pCtx;
  int rc;
  IncrMerger *pIncr;
  uint in_stack_ffffffffffffffe0;
  int iVar1;
  
  iVar1 = 0;
  if (*(long *)(in_RDI + 0x48) != 0) {
    if (*(int *)(*(long *)(in_RDI + 0x48) + 0x20) == 0) {
      iVar1 = vdbePmaReaderIncrMergeInit((PmaReader *)pCtx,(int)((ulong)in_RDI >> 0x20));
    }
    else {
      iVar1 = vdbeSorterCreateThread
                        ((SortSubtask *)(ulong)in_stack_ffffffffffffffe0,in_RDI,(void *)0x1784f7);
    }
  }
  return iVar1;
}

Assistant:

static int vdbePmaReaderIncrInit(PmaReader *pReadr, int eMode){
  IncrMerger *pIncr = pReadr->pIncr;   /* Incremental merger */
  int rc = SQLITE_OK;                  /* Return code */
  if( pIncr ){
#if SQLITE_MAX_WORKER_THREADS>0
    assert( pIncr->bUseThread==0 || eMode==INCRINIT_TASK );
    if( pIncr->bUseThread ){
      void *pCtx = (void*)pReadr;
      rc = vdbeSorterCreateThread(pIncr->pTask, vdbePmaReaderBgIncrInit, pCtx);
    }else
#endif
    {
      rc = vdbePmaReaderIncrMergeInit(pReadr, eMode);
    }
  }
  return rc;
}